

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::xr_object(xr_object *this,xr_surface_factory *surface_factory)

{
  allocator<char> local_2d [20];
  allocator<char> local_19;
  xr_surface_factory *local_18;
  xr_surface_factory *surface_factory_local;
  xr_object *this_local;
  
  local_18 = surface_factory;
  surface_factory_local = &this->super_xr_surface_factory;
  xr_surface_factory::xr_surface_factory(&this->super_xr_surface_factory);
  (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)&PTR__xr_object_0038cfb0
  ;
  this->m_flags = 0;
  std::__cxx11::string::string((string *)&this->m_userdata);
  std::__cxx11::string::string((string *)&this->m_lod_ref);
  std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::vector
            (&this->m_surfaces);
  std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>::vector(&this->m_meshes);
  std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::vector(&this->m_bones);
  std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::vector
            (&this->m_motions);
  std::__cxx11::string::string((string *)&this->m_motion_refs);
  std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::vector
            (&this->m_partitions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_owner_name,"unknown",&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->m_creation_time = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_modif_name,"unknown",local_2d);
  std::allocator<char>::~allocator(local_2d);
  this->m_modified_time = 0;
  this->m_surface_factory = local_18;
  std::
  unordered_map<xray_re::xr_raw_surface,_xray_re::xr_surface_*,_std::hash<xray_re::xr_raw_surface>,_std::equal_to<xray_re::xr_raw_surface>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>_>
  ::unordered_map(&this->m_raw_surfaces);
  _vector3<float>::set(&this->m_position,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_rotation,0.0,0.0,0.0);
  return;
}

Assistant:

xr_object::xr_object(const xr_surface_factory* surface_factory):
	m_flags(EOF_STATIC),
	m_owner_name("unknown"), m_creation_time(0),
	m_modif_name("unknown"), m_modified_time(0),
	m_surface_factory(surface_factory)
{
	m_position.set();
	m_rotation.set();
}